

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingExpandTruth(uint *uTruth,int nVars)

{
  uint uVar1;
  int nVars_local;
  uint *uTruth_local;
  
  if (6 < nVars) {
    __assert_fail("nVars < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                  ,0x2a0,"void Map_MappingExpandTruth(unsigned int *, int)");
  }
  if (nVars != 6) {
    if (nVars < 5) {
      *uTruth = 0xffffffffU >> (0x20U - (char)(1 << ((byte)nVars & 0x1f)) & 0x1f) & *uTruth;
      uVar1 = Map_MappingExpandTruth_rec(*uTruth,nVars);
      *uTruth = uVar1;
    }
    uTruth[1] = *uTruth;
  }
  return;
}

Assistant:

void Map_MappingExpandTruth( unsigned uTruth[2], int nVars )
{
    assert( nVars < 7 );
    if ( nVars == 6 )
        return;
    if ( nVars < 5 )
    {
        uTruth[0] &= MAP_MASK( (1<<nVars) );
        uTruth[0]  = Map_MappingExpandTruth_rec( uTruth[0], nVars );
    }
    uTruth[1] = uTruth[0];
}